

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

int64_t __thiscall mkvmuxer::Segment::MaxOffset(Segment *this)

{
  uint64_t uVar1;
  long lVar2;
  Cluster *in_RDI;
  Cluster *cluster;
  int32_t i;
  int64_t offset;
  int local_1c;
  long local_18;
  long local_8;
  
  if (in_RDI[0xf].timecode_scale_ == 0) {
    local_8 = -1;
  }
  else {
    local_18 = (**(code **)(*(long *)in_RDI[0xf].timecode_scale_ + 8))();
    local_18 = local_18 - (long)in_RDI[0xe].writer_;
    if (((ulong)in_RDI[1].stored_frames_._M_t._M_impl.super__Rb_tree_header._M_header._M_left & 1)
        != 0) {
      for (local_1c = 0;
          local_1c <
          *(int *)&in_RDI[1].last_block_timestamp_._M_t._M_impl.super__Rb_tree_header._M_header.
                   field_0x4; local_1c = local_1c + 1) {
        uVar1 = Cluster::Size(in_RDI);
        local_18 = uVar1 + local_18;
      }
      if (in_RDI[0xf].timecode_ != 0) {
        lVar2 = (**(code **)(*(long *)in_RDI[0xf].timecode_ + 8))();
        local_18 = lVar2 + local_18;
      }
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

int64_t Segment::MaxOffset() {
  if (!writer_header_)
    return -1;

  int64_t offset = writer_header_->Position() - payload_pos_;

  if (chunking_) {
    for (int32_t i = 0; i < cluster_list_size_; ++i) {
      Cluster* const cluster = cluster_list_[i];
      offset += cluster->Size();
    }

    if (writer_cues_)
      offset += writer_cues_->Position();
  }

  return offset;
}